

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O2

char * ORPG::Core::program_name(char *str)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(str,0x2f);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = str;
  }
  return pcVar2;
}

Assistant:

char* program_name(char* str) {
            char* ret;

            ret = strrchr(str, '/');
            if(ret)
                ret++;
            else
                ret = str;

            return ret;
        }